

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  padding_info padding_00;
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_00;
  pointer this_00;
  padding_info pVar3;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_a8;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  local_a0;
  size_t local_98;
  undefined8 uStack_90;
  size_t local_88;
  undefined8 uStack_80;
  padding_info local_70;
  tuple<spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
  local_60;
  undefined1 auStack_58 [8];
  padding_info padding;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  const_iterator end;
  string *pattern_local;
  pattern_formatter *this_local;
  
  user_chars._M_t.
  super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
  .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
       (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
        )std::__cxx11::string::end();
  std::
  unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>>
  ::unique_ptr<std::default_delete<spdlog::details::aggregate_formatter>,void>
            ((unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>>
              *)&it);
  CLI::std::
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ::clear(&this->formatters_);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&user_chars);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    if (*pcVar2 == '%') {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&it);
      if (bVar1) {
        std::
        unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
        ::
        unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
                  ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                    *)&local_38,
                   (unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                    *)&it);
        CLI::std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
        ::push_back(&this->formatters_,(value_type *)&local_38);
        CLI::std::
        unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
        ::~unique_ptr(&local_38);
      }
      it_00 = __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_30);
      local_60.
      super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
      .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )(_Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
              )user_chars._M_t.
               super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
               .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl;
      pVar3 = handle_padspec_(it_00,(const_iterator)
                                    user_chars._M_t.
                                    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                                    .
                                    super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>
                                    ._M_head_impl);
      auStack_58 = (undefined1  [8])pVar3.width_;
      local_70.side_ = pVar3.side_;
      padding.width_._0_4_ = local_70.side_;
      local_70._12_2_ = pVar3._12_2_;
      padding.width_._4_1_ = local_70.truncate_;
      padding.width_._5_1_ = local_70.enabled_;
      local_70 = pVar3;
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&user_chars);
      if (!bVar1) break;
      bVar1 = details::padding_info::enabled((padding_info *)auStack_58);
      if (bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        uStack_80 = CONCAT26(padding.width_._6_2_,
                             CONCAT24(padding.width_._4_2_,(pad_side)padding.width_));
        local_88 = (size_t)auStack_58;
        pVar3.side_ = (pad_side)padding.width_;
        pVar3.truncate_ = (bool)(char)padding.width_._4_2_;
        pVar3.enabled_ = (bool)(char)((ushort)padding.width_._4_2_ >> 8);
        pVar3._14_2_ = padding.width_._6_2_;
        pVar3.width_ = (size_t)auStack_58;
        handle_flag_<spdlog::details::scoped_padder>(this,*pcVar2,pVar3);
      }
      else {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        uStack_90 = CONCAT26(padding.width_._6_2_,
                             CONCAT24(padding.width_._4_2_,(pad_side)padding.width_));
        local_98 = (size_t)auStack_58;
        padding_00.side_ = (pad_side)padding.width_;
        padding_00.truncate_ = (bool)(char)padding.width_._4_2_;
        padding_00.enabled_ = (bool)(char)((ushort)padding.width_._4_2_ >> 8);
        padding_00._14_2_ = padding.width_._6_2_;
        padding_00.width_ = (size_t)auStack_58;
        handle_flag_<spdlog::details::null_scoped_padder>(this,*pcVar2,padding_00);
      }
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&it);
      if (!bVar1) {
        CLI::std::make_unique<spdlog::details::aggregate_formatter>();
        CLI::std::
        unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::operator=((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     *)&it,&local_a0);
        CLI::std::
        unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::~unique_ptr(&local_a0);
      }
      this_00 = CLI::std::
                unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                ::operator->((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                              *)&it);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      details::aggregate_formatter::add_ch(this_00,*pcVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&it);
  if (bVar1) {
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_a8,
               (unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                *)&it);
    CLI::std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_a8);
    CLI::std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_a8);
  }
  CLI::std::
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 *)&it);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}